

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O3

void embarrasing_starvation(size_t W)

{
  char *pcVar1;
  int *piVar2;
  int iVar3;
  code *pcVar4;
  double dVar5;
  FlowBuilder this;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  TestCaseData *pTVar7;
  long *plVar8;
  Executor *this_00;
  ulong uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar11;
  in_place_type_t<tf::Node::Module> local_42a;
  DefaultTaskParams local_429;
  size_t W_local;
  size_t B;
  ResultBuilder DOCTEST_RB_1;
  Result local_3a0;
  atomic<unsigned_long> barrier;
  shared_ptr<tf::WorkerInterface> local_378;
  Expression_lhs<const_unsigned_long> local_368;
  mutex mutex;
  Executor executor;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  Taskflow taskflow;
  Taskflow parent;
  
  parent.super_FlowBuilder._graph = (Graph *)&B;
  B = 0x10000;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  executor._notifier._state.super___atomic_base<unsigned_long>._M_i._7_1_ = '\x17';
  executor._notifier._waiters.
  super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  executor._notifier._waiters.
  super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = '\x17';
  executor._taskflows_mutex.super___mutex_base._M_mutex.__align =
       *(long *)(doctest::detail::g_cs + 0x20);
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__owner = 0xc;
  executor._taskflows_mutex.super___mutex_base._M_mutex._16_8_ = anon_var_dwarf_5300a;
  executor._taskflows_mutex.super___mutex_base._M_mutex._24_4_ = 0x1af;
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)anon_var_dwarf_53236;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 1;
  executor._topology_cv = (condition_variable)0x0;
  executor._104_8_ = (long)"TracerPid:\t" + 0xb;
  executor._112_8_ = (long)"TracerPid:\t" + 0xb;
  parent._mutex.super___mutex_base._M_mutex.__data.__lock = 0xc;
  W_local = W;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator><unsigned_long,_nullptr>
            ((Result *)&taskflow,(Expression_lhs<const_unsigned_long_&> *)&parent,&W_local);
  doctest::String::operator=((String *)&executor._notifier._waiters,(String *)&taskflow._mutex);
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ =
       CONCAT11(executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                _M_impl.super__Vector_impl_data._M_start._1_1_,
                taskflow.super_FlowBuilder._graph._0_1_) ^ 1;
  uVar10 = extraout_XMM0_Da;
  uVar11 = extraout_XMM0_Db;
  if (((long)taskflow._mutex.super___mutex_base._M_mutex._16_8_ < 0) &&
     (taskflow._mutex.super___mutex_base._M_mutex.__align != 0)) {
    operator_delete__((void *)taskflow._mutex.super___mutex_base._M_mutex.__align);
    uVar10 = extraout_XMM0_Da_00;
    uVar11 = extraout_XMM0_Db_00;
  }
  doctest::detail::ResultBuilder::log((ResultBuilder *)&executor,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL != '\0') {
    pcVar4 = (code *)swi(3);
    (*pcVar4)();
    return;
  }
  if ((char)executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
            super__Vector_impl_data._M_start == '\x01') {
    bVar6 = doctest::detail::checkIfShouldThrow
                      (executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__owner);
    if (bVar6) goto LAB_0011257f;
  }
  if ((executor._notifier._waiters.
       super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ < '\0') &&
     ((void *)CONCAT71(executor._notifier._waiters.
                       super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                       executor._notifier._waiters.
                       super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(executor._notifier._waiters.
                                       super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       executor._notifier._waiters.
                                       super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if ((executor._notifier._state.super___atomic_base<unsigned_long>._M_i._7_1_ < '\0') &&
     ((void *)CONCAT71(executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(executor._workers.
                                       super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                       executor._workers.
                                       super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_1_));
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  parent.super_FlowBuilder._graph = &parent._graph;
  parent._mutex.super___mutex_base._M_mutex.__align = 0;
  parent._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  parent._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  parent._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  parent._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  parent._name._M_dataplus._M_p = (pointer)&parent._name.field_2;
  parent._name._M_string_length = 0;
  parent._name.field_2._M_local_buf[0] = '\0';
  parent._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parent._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parent._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  parent._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&parent._topologies,0);
  parent._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload.
  super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  local_378.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_378.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W_local,&local_378);
  if (local_378.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  barrier.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (B != 0) {
    uVar9 = 0;
    do {
      this._graph = taskflow.super_FlowBuilder._graph;
      pTVar7 = (TestCaseData *)operator_new(0xd8);
      (pTVar7->m_file).field_0.data.ptr = (char *)0x0;
      *(uint **)((long)&(pTVar7->m_file).field_0 + 8) = &pTVar7->m_line;
      *(undefined8 *)((long)&(pTVar7->m_file).field_0 + 0x10) = 0;
      *(undefined1 *)&pTVar7->m_line = 0;
      pcVar1 = (char *)((long)&pTVar7[1].m_file.field_0 + 0x10);
      pTVar7->m_test_suite = (char *)0x0;
      pTVar7->m_description = (char *)0x0;
      pTVar7->m_skip = false;
      pTVar7->m_no_breaks = false;
      pTVar7->m_no_output = false;
      pTVar7->m_may_fail = false;
      pTVar7->m_should_fail = false;
      *(undefined3 *)&pTVar7->field_0x3d = 0;
      *(undefined8 *)&pTVar7->m_expected_failures = 0;
      pTVar7->m_timeout = (double)pcVar1;
      pTVar7[1].m_file.field_0.data.ptr = pcVar1;
      *(char ***)((long)&pTVar7[1].m_file.field_0 + 8) = &pTVar7[1].m_description;
      pTVar7[1].m_description = (char *)0x0;
      pTVar7[1].m_skip = false;
      pTVar7[1].m_no_breaks = false;
      pTVar7[1].m_no_output = false;
      pTVar7[1].m_may_fail = false;
      pTVar7[1].m_should_fail = false;
      *(undefined3 *)&pTVar7[1].field_0x3d = 0;
      *(undefined8 *)&pTVar7[1].m_expected_failures = 0;
      pTVar7[1].m_timeout = 0.0;
      pTVar7[2].m_file.field_0.data.ptr = (char *)0x0;
      plVar8 = (long *)operator_new(0x28);
      *plVar8 = (long)&mutex;
      plVar8[1] = (long)&set;
      plVar8[2] = (long)&executor;
      plVar8[3] = (long)&barrier;
      plVar8[4] = (long)&W_local;
      *(long **)&pTVar7[1].m_skip = plVar8;
      pTVar7[2].m_file.field_0.data.ptr =
           (char *)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:444:22)>
                   ::_M_invoke;
      pTVar7[1].m_timeout =
           (double)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:444:22)>
                   ::_M_manager;
      *(undefined1 *)&pTVar7[2].m_name = 1;
      pTVar7[2].m_test_suite = (char *)0x0;
      pTVar7[2].m_description = (char *)0x0;
      DOCTEST_RB_1.super_AssertData.m_test_case = pTVar7;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)this._graph,
                 (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB_1);
      if (DOCTEST_RB_1.super_AssertData.m_test_case != (TestCaseData *)0x0) {
        std::default_delete<tf::Node>::operator()
                  ((default_delete<tf::Node> *)&DOCTEST_RB_1,
                   (Node *)DOCTEST_RB_1.super_AssertData.m_test_case);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < B);
  }
  DOCTEST_RB_1.super_AssertData.m_test_case = (TestCaseData *)0x0;
  local_3a0.m_passed = false;
  local_3a0._1_7_ = 0;
  local_368.lhs = (ulong)local_368.lhs._4_4_ << 0x20;
  tf::Graph::
  _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
            (parent.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,&local_429,
             (void **)&DOCTEST_RB_1,(void **)&local_3a0,(int *)&local_368,&local_42a,&taskflow);
  local_3a0.m_passed = true;
  local_3a0._1_7_ = 0;
  this_00 = &executor;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            ((Future<void> *)&DOCTEST_RB_1,this_00,&parent,(anon_class_8_1_69701ed9 *)&local_3a0,
             (anon_class_1_0_00000001 *)&local_368);
  if (DOCTEST_RB_1.super_AssertData.m_test_case != (TestCaseData *)0x0) {
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)DOCTEST_RB_1.super_AssertData.m_test_case,this_00);
    plVar8 = (long *)CONCAT44(DOCTEST_RB_1.super_AssertData._28_4_,
                              DOCTEST_RB_1.super_AssertData.m_line);
    if (plVar8 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar2 = (int *)((long)plVar8 + 0xc);
        iVar3 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
      }
      else {
        iVar3 = *(int *)((long)plVar8 + 0xc);
        *(int *)((long)plVar8 + 0xc) = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (**(code **)(*plVar8 + 0x18))();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(DOCTEST_RB_1.super_AssertData._12_4_,DOCTEST_RB_1.super_AssertData.m_at) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(DOCTEST_RB_1.super_AssertData._12_4_,DOCTEST_RB_1.super_AssertData.m_at));
    }
    DOCTEST_RB_1.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB_1.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    DOCTEST_RB_1.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    DOCTEST_RB_1.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB_1.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB_1.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB_1.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp"
    ;
    DOCTEST_RB_1.super_AssertData.m_line = 0x1cf;
    DOCTEST_RB_1.super_AssertData.m_expr = "set.size() == W";
    DOCTEST_RB_1.super_AssertData.m_failed = true;
    DOCTEST_RB_1.super_AssertData.m_threw = false;
    DOCTEST_RB_1.super_AssertData.m_threw_as = false;
    DOCTEST_RB_1.super_AssertData.m_exception_type = "";
    DOCTEST_RB_1.super_AssertData.m_exception_string = "";
    local_368.lhs = set._M_h._M_element_count;
    local_368.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
              (&local_3a0,&local_368,&W_local);
    doctest::String::operator=(&DOCTEST_RB_1.super_AssertData.m_decomp,&local_3a0.m_decomp);
    DOCTEST_RB_1.super_AssertData._40_2_ =
         CONCAT11(DOCTEST_RB_1.super_AssertData.m_threw,local_3a0.m_passed) ^ 1;
    uVar10 = extraout_XMM0_Da_01;
    uVar11 = extraout_XMM0_Db_01;
    if ((local_3a0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_3a0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_3a0.m_decomp.field_0.data.ptr);
      uVar10 = extraout_XMM0_Da_02;
      uVar11 = extraout_XMM0_Db_02;
    }
    dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB_1,(double)CONCAT44(uVar11,uVar10));
    if (extraout_AL_00 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar5,0));
      return;
    }
    if (DOCTEST_RB_1.super_AssertData.m_failed == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(DOCTEST_RB_1.super_AssertData.m_at);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((DOCTEST_RB_1.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB_1.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB_1.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB_1.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB_1.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB_1.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB_1.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB_1.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
    {
      operator_delete__((void *)CONCAT71(DOCTEST_RB_1.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB_1.super_AssertData.m_exception.field_0.buf[0]));
    }
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&set._M_h);
    tf::Executor::~Executor(&executor);
    tf::Taskflow::~Taskflow(&parent);
    tf::Taskflow::~Taskflow(&taskflow);
    return;
  }
  std::__throw_future_error(3);
LAB_0011257f:
  doctest::detail::throwException();
}

Assistant:

void embarrasing_starvation(size_t W) {

  size_t B = 65536;

  REQUIRE(B > W);
  
  tf::Taskflow taskflow, parent;
  tf::Executor executor(W);

  std::atomic<size_t> barrier{0};

  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  // fork
  for(size_t b=0; b<B; b++) {
    taskflow.emplace([&](){
      // record worker
      {
        std::scoped_lock lock(mutex);
        set.insert(executor.this_worker_id());
      }

      // all threads should be notified
      barrier.fetch_add(1, std::memory_order_relaxed);
      while(barrier.load(std::memory_order_relaxed) < W) {
        std::this_thread::yield();
      }
    });
  }

  parent.composed_of(taskflow);

  executor.run(parent).wait();

  REQUIRE(set.size() == W);
}